

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtGenericNodeCheck(xmlDebugCtxtPtr ctxt,xmlNodePtr node)

{
  _xmlDoc *p_Var1;
  _xmlDict *p_Var2;
  xmlChar *pxVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlNsPtr local_30;
  xmlNsPtr ns;
  xmlDictPtr dict;
  xmlDocPtr doc;
  xmlNodePtr node_local;
  xmlDebugCtxtPtr ctxt_local;
  
  p_Var1 = node->doc;
  if (node->parent == (_xmlNode *)0x0) {
    xmlDebugErr(ctxt,0x1395,"Node has no parent\n");
  }
  if (node->doc == (_xmlDoc *)0x0) {
    xmlDebugErr(ctxt,0x1396,"Node has no doc\n");
  }
  else {
    p_Var2 = p_Var1->dict;
    if ((p_Var2 == (_xmlDict *)0x0) && (ctxt->nodict == 0)) {
      ctxt->nodict = 1;
    }
    if (ctxt->doc == (xmlDocPtr)0x0) {
      ctxt->doc = p_Var1;
    }
    if (ctxt->dict == (xmlDictPtr)0x0) {
      ctxt->dict = p_Var2;
    }
  }
  if (((node->parent != (_xmlNode *)0x0) && (node->doc != node->parent->doc)) &&
     (iVar4 = xmlStrEqual(node->name,(xmlChar *)"pseudoroot"), iVar4 == 0)) {
    xmlDebugErr(ctxt,0x1399,"Node doc differs from parent\'s one\n");
  }
  if (node->prev == (_xmlNode *)0x0) {
    if (node->type == XML_ATTRIBUTE_NODE) {
      if ((node->parent != (_xmlNode *)0x0) && (node != (xmlNodePtr)node->parent->properties)) {
        xmlDebugErr(ctxt,0x139a,"Attr has no prev and not first of attr list\n");
      }
    }
    else if ((node->parent != (_xmlNode *)0x0) && (node->parent->children != node)) {
      xmlDebugErr(ctxt,0x139a,"Node has no prev and not first of parent list\n");
    }
  }
  else if (node->prev->next != node) {
    xmlDebugErr(ctxt,0x139b,"Node prev->next : back link wrong\n");
  }
  if (node->next == (_xmlNode *)0x0) {
    if ((((node->parent != (_xmlNode *)0x0) && (node->type != XML_ATTRIBUTE_NODE)) &&
        (node->parent->last != node)) && (node->parent->type == XML_ELEMENT_NODE)) {
      xmlDebugErr(ctxt,0x139c,"Node has no next and not last of parent list\n");
    }
  }
  else {
    if (node->next->prev != node) {
      xmlDebugErr(ctxt,0x139d,"Node next->prev : forward link wrong\n");
    }
    if (node->next->parent != node->parent) {
      xmlDebugErr(ctxt,0x13a5,"Node next->prev : forward link wrong\n");
    }
  }
  if (node->type == XML_ELEMENT_NODE) {
    for (local_30 = node->nsDef; local_30 != (xmlNsPtr)0x0; local_30 = local_30->next) {
      xmlCtxtNsCheckScope(ctxt,node,local_30);
    }
    if (node->ns != (xmlNs *)0x0) {
      xmlCtxtNsCheckScope(ctxt,node,node->ns);
    }
  }
  else if ((node->type == XML_ATTRIBUTE_NODE) && (node->ns != (xmlNs *)0x0)) {
    xmlCtxtNsCheckScope(ctxt,node,node->ns);
  }
  if ((((node->type != XML_ELEMENT_NODE) && (node->type != XML_ATTRIBUTE_NODE)) &&
      ((node->type != XML_ELEMENT_DECL &&
       (((node->type != XML_ATTRIBUTE_DECL && (node->type != XML_DTD_NODE)) &&
        (node->type != XML_HTML_DOCUMENT_NODE)))))) &&
     ((node->type != XML_DOCUMENT_NODE && (node->content != (xmlChar *)0x0)))) {
    xmlCtxtCheckString(ctxt,node->content);
  }
  switch(node->type) {
  case XML_ELEMENT_NODE:
  case XML_ATTRIBUTE_NODE:
    xmlCtxtCheckName(ctxt,node->name);
    break;
  case XML_TEXT_NODE:
    if (((node->name != "text") && (node->name != "textnoenc")) &&
       ((ctxt->dict == (xmlDictPtr)0x0 ||
        (pxVar3 = node->name, pxVar5 = xmlDictLookup(ctxt->dict,(xmlChar *)"nbktext",7),
        pxVar3 != pxVar5)))) {
      xmlDebugErr3(ctxt,0x13ac,"Text node has wrong name \'%s\'",(char *)node->name);
    }
    break;
  case XML_CDATA_SECTION_NODE:
    if (node->name != (xmlChar *)0x0) {
      xmlDebugErr3(ctxt,0x13ad,"CData section has non NULL name \'%s\'",(char *)node->name);
    }
    break;
  case XML_ENTITY_REF_NODE:
  case XML_ENTITY_NODE:
  case XML_DOCUMENT_NODE:
  case XML_DOCUMENT_TYPE_NODE:
  case XML_DOCUMENT_FRAG_NODE:
  case XML_NOTATION_NODE:
  case XML_HTML_DOCUMENT_NODE:
  case XML_DTD_NODE:
  case XML_ELEMENT_DECL:
  case XML_ATTRIBUTE_DECL:
  case XML_ENTITY_DECL:
  case XML_NAMESPACE_DECL:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    break;
  case XML_PI_NODE:
    xmlCtxtCheckName(ctxt,node->name);
    break;
  case XML_COMMENT_NODE:
    if (node->name != "comment") {
      xmlDebugErr3(ctxt,0x13ac,"Comment node has wrong name \'%s\'",(char *)node->name);
    }
  }
  return;
}

Assistant:

static void
xmlCtxtGenericNodeCheck(xmlDebugCtxtPtr ctxt, xmlNodePtr node) {
    xmlDocPtr doc;
    xmlDictPtr dict;

    doc = node->doc;

    if (node->parent == NULL)
        xmlDebugErr(ctxt, XML_CHECK_NO_PARENT,
	            "Node has no parent\n");
    if (node->doc == NULL) {
        xmlDebugErr(ctxt, XML_CHECK_NO_DOC,
	            "Node has no doc\n");
        dict = NULL;
    } else {
	dict = doc->dict;
	if ((dict == NULL) && (ctxt->nodict == 0)) {
#if 0
            /* deactivated right now as it raises too many errors */
	    if (doc->type == XML_DOCUMENT_NODE)
		xmlDebugErr(ctxt, XML_CHECK_NO_DICT,
			    "Document has no dictionary\n");
#endif
	    ctxt->nodict = 1;
	}
	if (ctxt->doc == NULL)
	    ctxt->doc = doc;

	if (ctxt->dict == NULL) {
	    ctxt->dict = dict;
	}
    }
    if ((node->parent != NULL) && (node->doc != node->parent->doc) &&
        (!xmlStrEqual(node->name, BAD_CAST "pseudoroot")))
        xmlDebugErr(ctxt, XML_CHECK_WRONG_DOC,
	            "Node doc differs from parent's one\n");
    if (node->prev == NULL) {
        if (node->type == XML_ATTRIBUTE_NODE) {
	    if ((node->parent != NULL) &&
	        (node != (xmlNodePtr) node->parent->properties))
		xmlDebugErr(ctxt, XML_CHECK_NO_PREV,
                    "Attr has no prev and not first of attr list\n");

        } else if ((node->parent != NULL) && (node->parent->children != node))
	    xmlDebugErr(ctxt, XML_CHECK_NO_PREV,
                    "Node has no prev and not first of parent list\n");
    } else {
        if (node->prev->next != node)
	    xmlDebugErr(ctxt, XML_CHECK_WRONG_PREV,
                        "Node prev->next : back link wrong\n");
    }
    if (node->next == NULL) {
	if ((node->parent != NULL) && (node->type != XML_ATTRIBUTE_NODE) &&
	    (node->parent->last != node) &&
	    (node->parent->type == XML_ELEMENT_NODE))
	    xmlDebugErr(ctxt, XML_CHECK_NO_NEXT,
                    "Node has no next and not last of parent list\n");
    } else {
        if (node->next->prev != node)
	    xmlDebugErr(ctxt, XML_CHECK_WRONG_NEXT,
                    "Node next->prev : forward link wrong\n");
        if (node->next->parent != node->parent)
	    xmlDebugErr(ctxt, XML_CHECK_WRONG_PARENT,
                    "Node next->prev : forward link wrong\n");
    }
    if (node->type == XML_ELEMENT_NODE) {
        xmlNsPtr ns;

	ns = node->nsDef;
	while (ns != NULL) {
	    xmlCtxtNsCheckScope(ctxt, node, ns);
	    ns = ns->next;
	}
	if (node->ns != NULL)
	    xmlCtxtNsCheckScope(ctxt, node, node->ns);
    } else if (node->type == XML_ATTRIBUTE_NODE) {
	if (node->ns != NULL)
	    xmlCtxtNsCheckScope(ctxt, node, node->ns);
    }

    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE) &&
	(node->type != XML_ELEMENT_DECL) &&
	(node->type != XML_ATTRIBUTE_DECL) &&
	(node->type != XML_DTD_NODE) &&
	(node->type != XML_HTML_DOCUMENT_NODE) &&
	(node->type != XML_DOCUMENT_NODE)) {
	if (node->content != NULL)
	    xmlCtxtCheckString(ctxt, (const xmlChar *) node->content);
    }
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    xmlCtxtCheckName(ctxt, node->name);
	    break;
        case XML_TEXT_NODE:
	    if ((node->name == xmlStringText) ||
	        (node->name == xmlStringTextNoenc))
		break;
	    /* some case of entity substitution can lead to this */
	    if ((ctxt->dict != NULL) &&
	        (node->name == xmlDictLookup(ctxt->dict, BAD_CAST "nbktext",
		                             7)))
		break;

	    xmlDebugErr3(ctxt, XML_CHECK_WRONG_NAME,
			 "Text node has wrong name '%s'",
			 (const char *) node->name);
	    break;
        case XML_COMMENT_NODE:
	    if (node->name == xmlStringComment)
		break;
	    xmlDebugErr3(ctxt, XML_CHECK_WRONG_NAME,
			 "Comment node has wrong name '%s'",
			 (const char *) node->name);
	    break;
        case XML_PI_NODE:
	    xmlCtxtCheckName(ctxt, node->name);
	    break;
        case XML_CDATA_SECTION_NODE:
	    if (node->name == NULL)
		break;
	    xmlDebugErr3(ctxt, XML_CHECK_NAME_NOT_NULL,
			 "CData section has non NULL name '%s'",
			 (const char *) node->name);
	    break;
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_NAMESPACE_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    break;
    }
}